

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

Error * ot::commissioner::utils::ParseInteger<unsigned_short>
                  (Error *__return_storage_ptr__,unsigned_short *aInteger,string *aStr)

{
  ulonglong uVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string local_80;
  char *endPtr;
  pointer local_58;
  size_type sStack_50;
  undefined1 local_48 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  endPtr = (char *)0x0;
  uVar1 = strtoull((aStr->_M_dataplus)._M_p,&endPtr,0);
  if ((endPtr == (char *)0x0) || (endPtr != (aStr->_M_dataplus)._M_p + aStr->_M_string_length)) {
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
              ();
    local_58 = (aStr->_M_dataplus)._M_p;
    sStack_50 = aStr->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x19;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_(&local_80,(v10 *)"{} is not a valid integer",fmt,args);
    local_48._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_48 + 8),(string *)&local_80);
    Error::operator=(__return_storage_ptr__,(Error *)local_48);
    std::__cxx11::string::~string((string *)(local_48 + 8));
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    *aInteger = (unsigned_short)uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Error ParseInteger(T &aInteger, const std::string &aStr)
{
    Error    error;
    uint64_t integer;
    char    *endPtr = nullptr;

    integer = strtoull(aStr.c_str(), &endPtr, 0);

    VerifyOrExit(endPtr != nullptr && endPtr == aStr.c_str() + aStr.length(),
                 error = ERROR_INVALID_ARGS("{} is not a valid integer", aStr));

    aInteger = integer;

exit:
    return error;
}